

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_2019::DataTransform<double,_unsigned_long>::Run
          (DataTransform<double,_unsigned_long> *this,istream *input_stream)

{
  NumericType NVar1;
  WarningType WVar2;
  ulong uVar3;
  ulong uVar4;
  ostream *poVar5;
  size_t *__idx;
  long lVar6;
  ulong uVar7;
  int iVar8;
  bool bVar9;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  double dVar10;
  allocator local_281;
  istream *local_280;
  double input_data;
  string *local_270;
  ulong local_268;
  double local_260;
  ulong local_258;
  string local_250;
  string word;
  char buffer [128];
  
  local_270 = &this->print_format_;
  iVar8 = 0;
  local_280 = input_stream;
  do {
    if (this->is_ascii_input_ == true) {
      word._M_dataplus._M_p = (pointer)&word.field_2;
      word._M_string_length = 0;
      word.field_2._M_local_buf[0] = '\0';
      std::operator>>(local_280,(string *)&word);
      bVar9 = word._M_string_length == 0;
      if (!bVar9) {
        std::__cxx11::stold((longdouble *)&word,(string *)0x0,__idx);
        input_data = (double)in_ST0;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      std::__cxx11::string::~string((string *)&word);
      if (!bVar9) goto LAB_00133d16;
      if (bVar9) {
        if (bVar9) {
LAB_00133f71:
          bVar9 = true;
          if ((this->is_ascii_output_ == true) && (iVar8 % this->num_column_ != 0)) {
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          }
        }
        else {
LAB_00133f93:
          bVar9 = false;
        }
        return bVar9;
      }
    }
    else {
      bVar9 = sptk::ReadStream<double>(&input_data,local_280);
      if (!bVar9) goto LAB_00133f71;
LAB_00133d16:
      uVar4 = (long)(input_data - 9.223372036854776e+18) & (long)input_data >> 0x3f |
              (long)input_data;
      uVar7 = this->minimum_value_;
      uVar3 = this->maximum_value_;
      if (uVar7 < uVar3) {
        NVar1 = this->input_numeric_type_;
        if (NVar1 == kFloatingPoint) {
          local_260 = input_data;
          in_ST6 = in_ST5;
          local_258 = uVar7;
          if (((double)(long)uVar7 +
               (double)*(float *)(&DAT_00140b30 + (ulong)((long)uVar7 < 0) * 4) <= input_data) &&
             (uVar7 = uVar3, local_268 = uVar3,
             input_data <=
             (double)(long)uVar3 + (double)*(float *)(&DAT_00140b30 + (ulong)((long)uVar3 < 0) * 4))
             ) goto LAB_00133dfe;
        }
        else if (NVar1 == kUnsignedInteger) {
          if (uVar7 <= uVar4) {
            bVar9 = uVar3 < uVar4;
            uVar7 = uVar4;
            if (bVar9) {
              uVar7 = uVar3;
            }
            goto LAB_00133e00;
          }
        }
        else {
          if (NVar1 != kSignedInteger) goto LAB_00133dfe;
          lVar6 = (long)input_data;
          if ((long)uVar7 <= lVar6) {
            bVar9 = (long)uVar3 < lVar6;
            uVar7 = uVar4;
            if ((long)uVar3 < lVar6) {
              uVar7 = uVar3;
            }
            goto LAB_00133e00;
          }
        }
LAB_00133e32:
        if (this->warning_type_ != kIgnore) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&word);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&word,iVar8);
          std::operator<<(poVar5,"th data is over the range of output type");
          std::__cxx11::string::string((string *)&local_250,"x2x",&local_281);
          sptk::PrintErrorMessage(&local_250,(ostringstream *)&word);
          std::__cxx11::string::~string((string *)&local_250);
          WVar2 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&word);
          if (WVar2 == kExit) goto LAB_00133f93;
        }
      }
      else {
LAB_00133dfe:
        bVar9 = false;
        uVar7 = uVar4;
LAB_00133e00:
        if ((bVar9) || (this->rounding_ == false)) {
          if (bVar9) goto LAB_00133e32;
        }
        else {
          if (input_data <= 0.0) {
            dVar10 = input_data + -0.5;
          }
          else {
            dVar10 = input_data + 0.5;
          }
          uVar7 = (long)(dVar10 - 9.223372036854776e+18) & (long)dVar10 >> 0x3f | (long)dVar10;
        }
      }
      if (this->is_ascii_output_ == true) {
        bVar9 = sptk::SnPrintf<unsigned_long>(uVar7,local_270,0x80,buffer);
        if (!bVar9) goto LAB_00133f93;
        std::operator<<((ostream *)&std::cout,buffer);
        if ((iVar8 + 1) % this->num_column_ == 0) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          in_ST7 = in_ST6;
        }
        else {
          std::operator<<((ostream *)&std::cout,"\t");
          in_ST7 = in_ST6;
        }
      }
      else {
        bVar9 = sptk::WriteStream<unsigned_long>(uVar7,(ostream *)&std::cout);
        in_ST7 = in_ST6;
        if (!bVar9) goto LAB_00133f93;
      }
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }